

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O3

int __thiscall CVmObjVector::equals(CVmObjVector *this,vm_obj_id_t self,vm_val_t *val,int depth)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  vm_val_t val1;
  vm_val_t val2;
  vm_val_t local_60;
  vm_val_t local_50;
  vm_val_t local_40;
  
  if (0x100 < depth) {
    err_throw(0x7ee);
  }
  if ((val->typ != VM_OBJ) || (iVar4 = 1, (val->val).obj != self)) {
    iVar2 = vm_val_t::is_listlike(val);
    iVar4 = 0;
    if ((iVar2 != 0) &&
       ((uVar3 = vm_val_t::ll_length(val), -1 < (int)uVar3 &&
        (iVar4 = 0, uVar3 == *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2))))
       ) {
      lVar6 = 4;
      uVar5 = 0;
      do {
        if (uVar3 == uVar5) {
          return 1;
        }
        pcVar1 = (this->super_CVmObjCollection).super_CVmObject.ext_;
        local_50.typ = (vm_datatype_t)pcVar1[lVar6];
        vmb_get_dh_val(pcVar1 + lVar6,&local_50);
        uVar5 = uVar5 + 1;
        local_60.typ = VM_INT;
        local_60.val.obj = (vm_obj_id_t)uVar5;
        vm_val_t::ll_index(val,&local_40,&local_60);
        iVar4 = vm_val_t::equals(&local_50,&local_40,depth + 1);
        lVar6 = lVar6 + 5;
      } while (iVar4 != 0);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int CVmObjVector::equals(VMG_ vm_obj_id_t self, const vm_val_t *val,
                         int depth) const
{
    int cnt;
    int cnt2;
    int idx;

    /* if the recursion depth is excessive, throw an error */
    if (depth > VM_MAX_TREE_DEPTH_EQ)
        err_throw(VMERR_TREE_TOO_DEEP_EQ);

    /* if the other value is a reference to myself, we certainly match */
    if (val->typ == VM_OBJ && val->val.obj == self)
    {
        /* no need to look at the contents if this is a reference to me */
        return TRUE;
    }

    /* if it's not list-like, it's not a match */
    if (!val->is_listlike(vmg0_) || (cnt2 = val->ll_length(vmg0_)) < 0)
        return FALSE;

    /* if the sizes don't match, the values are not equal */
    cnt = get_element_count();
    if (cnt != cnt2)
        return FALSE;

    /* compare element by element */
    for (idx = 0 ; idx < cnt ; ++idx)
    {
        vm_val_t val1;
        vm_val_t val2;
        
        /* get this element of self */
        get_element(idx, &val1);

        /* get this element of the other value */
        val->ll_index(vmg_ &val2, idx + 1);
        
        /* if these elements aren't equal, our values aren't equal */
        if (!val1.equals(vmg_ &val2, depth + 1))
            return FALSE;
    }

    /* we didn't find any differences, so the values are equal */
    return TRUE;
}